

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O3

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Sifm::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Sifm *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  pointer ppSVar1;
  uint32_t uVar2;
  uint uVar3;
  SingleMthdTest *pSVar4;
  result_type rVar5;
  Test *pTVar6;
  MthdDmaGrobj *this_01;
  MthdCtxPattern *this_02;
  MthdOperation *this_03;
  MthdCtxSurf2D *this_04;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_431;
  undefined1 local_430 [32];
  Test *local_410;
  SingleMthdTest *local_408;
  Test *local_400;
  Test *local_3f8;
  MthdCtxSurf2D *local_3f0;
  undefined1 local_3e8 [16];
  undefined1 *local_3d8;
  unsigned_long local_3d0;
  undefined1 local_3c8 [16];
  undefined1 *local_3b8;
  unsigned_long local_3b0;
  undefined1 local_3a8 [16];
  undefined1 *local_398;
  unsigned_long local_390;
  undefined1 local_388 [16];
  Test *local_378;
  Test *local_370;
  Test *local_368;
  Test *local_360;
  Test *local_358;
  undefined1 *local_350;
  unsigned_long local_348;
  undefined1 local_340 [16];
  SingleMthdTest *local_330;
  Test *local_328;
  undefined1 local_320 [240];
  undefined1 *local_230;
  unsigned_long local_228;
  undefined1 local_220 [16];
  undefined1 *local_210;
  unsigned_long local_208;
  undefined1 local_200 [16];
  undefined1 *local_1f0;
  unsigned_long local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  unsigned_long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  unsigned_long local_1a8;
  undefined1 local_1a0 [16];
  undefined1 *local_190;
  unsigned_long local_188;
  undefined1 local_180 [16];
  undefined1 *local_170;
  unsigned_long local_168;
  undefined1 local_160 [16];
  undefined1 *local_150;
  unsigned_long local_148;
  undefined1 local_140 [16];
  undefined1 *local_130;
  unsigned_long local_128;
  undefined1 local_120 [16];
  undefined1 *local_110;
  unsigned_long local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  unsigned_long local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  unsigned_long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  unsigned_long local_a8;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  pSVar4 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_320._232_8_ = pSVar4;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_430._0_8_ = local_430 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"nop","");
  opt = &(this->super_Class).opt;
  uVar2 = (this->super_Class).cls;
  Test::Test((Test *)pSVar4,opt,(uint32_t)rVar5);
  (pSVar4->super_MthdTest).trapbit = -1;
  (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356770;
  pSVar4->s_cls = uVar2;
  pSVar4->s_mthd = 0x100;
  pSVar4->s_stride = 4;
  pSVar4->s_num = 1;
  pSVar4->s_trapbit = -1;
  (pSVar4->name)._M_dataplus._M_p = (pointer)&(pSVar4->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pSVar4->name,local_430._0_8_,(pointer)(local_430._0_8_ + local_430._8_8_));
  (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356aa0;
  local_330 = pSVar4;
  pTVar6 = (Test *)operator_new(0x25950);
  local_320._224_8_ = pTVar6;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3f8 = (Test *)local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"notify","");
  uVar2 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_3f8,
             (long)&(local_3f0->super_SingleMthdTest).super_MthdTest.super_StateTest.
                    super_RepeatTest + (long)&(local_3f8 + 0x1e)[-0x1e]._vptr_Test);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356c90;
  local_328 = pTVar6;
  local_408 = (SingleMthdTest *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_398 = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"patch","");
  pSVar4 = local_408;
  uVar2 = (this->super_Class).cls;
  Test::Test((Test *)local_408,opt,(uint32_t)rVar5);
  (pSVar4->super_MthdTest).trapbit = -1;
  (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356770;
  pSVar4->s_cls = uVar2;
  pSVar4->s_mthd = 0x10c;
  pSVar4->s_stride = 4;
  pSVar4->s_num = 1;
  pSVar4->s_trapbit = -1;
  (pSVar4->name)._M_dataplus._M_p = (pointer)&(pSVar4->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&pSVar4->name,local_398,local_398 + local_390)
  ;
  (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00357830;
  local_320._0_8_ = pSVar4;
  pTVar6 = (Test *)operator_new(0x25950);
  local_320._216_8_ = pTVar6;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3b8 = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"pm_trigger","");
  uVar2 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_3b8,local_3b8 + local_3b0);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358ad0;
  local_320._8_8_ = pTVar6;
  local_410 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"dma_notify","");
  pTVar6 = local_410;
  uVar2 = (this->super_Class).cls;
  Test::Test(local_410,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 1;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_3d8,local_3d8 + local_3d0);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357928;
  local_320._16_8_ = pTVar6;
  this_01 = (MthdDmaGrobj *)operator_new(0x25960);
  local_320._208_8_ = this_01;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"dma_src","");
  MthdDmaGrobj::MthdDmaGrobj
            (this_01,opt,(uint32_t)rVar5,&local_50,2,(this->super_Class).cls,0x184,0,0);
  local_320._24_8_ = this_01;
  this_02 = (MthdCtxPattern *)operator_new(0x25958);
  local_320._200_8_ = this_02;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ctx_pattern","");
  uVar2 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern(this_02,opt,(uint32_t)rVar5,&local_70,3,uVar2,0x188,uVar2 != 0x37);
  local_320._32_8_ = this_02;
  local_400 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ctx_rop","");
  pTVar6 = local_400;
  uVar2 = (this->super_Class).cls;
  Test::Test(local_400,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x18c;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 4;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_b0,local_b0 + local_a8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357b18;
  local_320._40_8_ = pTVar6;
  pTVar6 = (Test *)operator_new(0x25950);
  local_320._192_8_ = pTVar6;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ctx_beta","");
  uVar2 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 400;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 5;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_d0,local_d0 + local_c8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357c10;
  local_320._48_8_ = pTVar6;
  local_358 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"missing","");
  pTVar6 = local_358;
  uVar2 = (this->super_Class).cls;
  Test::Test(local_358,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x200;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_f0,local_f0 + local_e8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358790;
  local_320._56_8_ = pTVar6;
  pTVar6 = (Test *)operator_new(0x25958);
  local_320._184_8_ = pTVar6;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"format","");
  uVar2 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x300;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 8;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_110,local_110 + local_108);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d4d8;
  *(bool *)(pTVar6[0x1e].rnd._M_x + 0x119) = uVar2 != 0x37;
  local_320._64_8_ = pTVar6;
  this_03 = (MthdOperation *)operator_new(0x25958);
  local_320._176_8_ = this_03;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"operation","");
  uVar2 = (this->super_Class).cls;
  MthdOperation::MthdOperation(this_03,opt,(uint32_t)rVar5,&local_90,9,uVar2,0x304,uVar2 != 0x37);
  local_320._72_8_ = this_03;
  local_360 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"clip_xy","");
  pTVar6 = local_360;
  uVar2 = (this->super_Class).cls;
  Test::Test(local_360,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x308;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 10;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_130,local_130 + local_128);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359958;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 1;
  *(undefined1 *)((long)pTVar6[0x1e].rnd._M_x + 0x8cc) = 0;
  local_320._80_8_ = pTVar6;
  pTVar6 = (Test *)operator_new(0x25958);
  local_320._168_8_ = pTVar6;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"clip_rect","");
  uVar2 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x30c;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xb;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_150,local_150 + local_148);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359a50;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 1;
  local_320._88_8_ = pTVar6;
  local_368 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"xy","");
  pTVar6 = local_368;
  uVar2 = (this->super_Class).cls;
  Test::Test(local_368,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x310;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_170,local_170 + local_168);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d5d0;
  local_320._96_8_ = pTVar6;
  local_370 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"rect","");
  pTVar6 = local_370;
  uVar2 = (this->super_Class).cls;
  Test::Test(local_370,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined8 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x400000314;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(uint *)(pTVar6[0x1e].rnd._M_x + 0x114) = (uVar2 != 0x37) + 0xb + (uint)(uVar2 != 0x37);
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_190,local_190 + local_188);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d6c8;
  local_320._104_8_ = pTVar6;
  pTVar6 = (Test *)operator_new(0x25958);
  local_320._160_8_ = pTVar6;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"dudx","");
  uVar2 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x318;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xe;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_1b0,local_1b0 + local_1a8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d7c0;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 0;
  local_320._112_8_ = pTVar6;
  local_378 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"dvdy","");
  pTVar6 = local_378;
  uVar2 = (this->super_Class).cls;
  Test::Test(local_378,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x31c;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xf;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_1d0,local_1d0 + local_1c8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d8b8;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 0;
  local_320._120_8_ = pTVar6;
  pTVar6 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"src_size","");
  uVar2 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x400;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0x10;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_1f0,local_1f0 + local_1e8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d9b0;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 0;
  local_320._128_8_ = pTVar6;
  pTVar6 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"pitch","");
  uVar2 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x404;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0x11;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_210,local_210 + local_208);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035daa8;
  local_320._136_8_ = pTVar6;
  pTVar6 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"offset","");
  uVar2 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x408;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0x12;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_230,local_230 + local_228);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035dba0;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 0;
  local_320._144_8_ = pTVar6;
  pTVar6 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_350 = local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"src_pos","");
  uVar2 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x40c;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0x13;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_350,local_350 + local_348);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035dc98;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 0;
  *(undefined1 *)((long)pTVar6[0x1e].rnd._M_x + 0x8cc) = 1;
  __l._M_len = 0x16;
  __l._M_array = &local_330;
  local_320._152_8_ = pTVar6;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_431);
  if (local_350 != local_340) {
    operator_delete(local_350);
  }
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  if (local_150 != local_140) {
    operator_delete(local_150);
  }
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8);
  }
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  if (local_398 != local_388) {
    operator_delete(local_398);
  }
  if (local_3f8 != (Test *)local_3e8) {
    operator_delete(local_3f8);
  }
  if ((undefined1 *)local_430._0_8_ != local_430 + 0x10) {
    operator_delete((void *)local_430._0_8_);
  }
  uVar2 = (this->super_Class).cls;
  if (uVar2 == 0xe) {
    pTVar6 = (Test *)(__return_storage_ptr__->
                     super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
    local_408 = (SingleMthdTest *)operator_new(0x25950);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_430._0_8_ = local_430 + 0x10;
    local_400 = pTVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"src_size_yuv420","");
    pSVar4 = local_408;
    uVar2 = (this->super_Class).cls;
    Test::Test((Test *)local_408,opt,(uint32_t)rVar5);
    (pSVar4->super_MthdTest).trapbit = -1;
    (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
         (_func_int **)&PTR__SingleMthdTest_00356770;
    pSVar4->s_cls = uVar2;
    pSVar4->s_mthd = 0x400;
    pSVar4->s_stride = 4;
    pSVar4->s_num = 1;
    pSVar4->s_trapbit = -1;
    (pSVar4->name)._M_dataplus._M_p = (pointer)&(pSVar4->name).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar4->name,local_430._0_8_,(pointer)(local_430._0_8_ + local_430._8_8_))
    ;
    (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
         (_func_int **)&PTR__SingleMthdTest_0035dd90;
    local_330 = pSVar4;
    local_410 = (Test *)operator_new(0x25950);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_3f8 = (Test *)local_3e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"pitch_yuv420","");
    pTVar6 = local_410;
    uVar2 = (this->super_Class).cls;
    Test::Test(local_410,opt,(uint32_t)rVar5);
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x404;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
    pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_3f8,
               (long)&(local_3f0->super_SingleMthdTest).super_MthdTest.super_StateTest.
                      super_RepeatTest + (long)&(local_3f8 + 0x1e)[-0x1e]._vptr_Test);
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035de88;
    local_328 = pTVar6;
    pSVar4 = (SingleMthdTest *)operator_new(0x25950);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_398 = local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"offset_yuv420","");
    uVar2 = (this->super_Class).cls;
    Test::Test((Test *)pSVar4,opt,(uint32_t)rVar5);
    (pSVar4->super_MthdTest).trapbit = -1;
    (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
         (_func_int **)&PTR__SingleMthdTest_00356770;
    pSVar4->s_cls = uVar2;
    pSVar4->s_mthd = 0x408;
    pSVar4->s_stride = 4;
    pSVar4->s_num = 3;
    pSVar4->s_trapbit = -1;
    (pSVar4->name)._M_dataplus._M_p = (pointer)&(pSVar4->name).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar4->name,local_398,local_398 + local_390);
    (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
         (_func_int **)&PTR__SingleMthdTest_0035df80;
    local_320._0_8_ = pSVar4;
    pTVar6 = (Test *)operator_new(0x25950);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_3b8 = local_3a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"src_pos_yuv420","");
    uVar2 = (this->super_Class).cls;
    Test::Test(pTVar6,opt,(uint32_t)rVar5);
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x414;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
    pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_3b8,local_3b8 + local_3b0);
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035e078;
    local_320._8_8_ = pTVar6;
    pTVar6 = (Test *)operator_new(0x25950);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_3d8 = local_3c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"invalid_yuv420","");
    uVar2 = (this->super_Class).cls;
    Test::Test(pTVar6,opt,(uint32_t)rVar5);
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x410;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 2;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
    pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_3d8,local_3d8 + local_3d0);
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035e170;
    local_320._16_8_ = pTVar6;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>
              ((vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
                *)__return_storage_ptr__,local_400,&local_330);
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8);
    }
    if (local_3b8 != local_3a8) {
      operator_delete(local_3b8);
    }
    if (local_398 != local_388) {
      operator_delete(local_398);
    }
    if (local_3f8 != (Test *)local_3e8) {
      operator_delete(local_3f8);
    }
    if ((undefined1 *)local_430._0_8_ != local_430 + 0x10) {
      operator_delete((void *)local_430._0_8_);
    }
    uVar2 = (this->super_Class).cls;
  }
  ppSVar1 = (__return_storage_ptr__->
            super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (uVar2 == 0x37) {
    pTVar6 = (Test *)operator_new(0x25958);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_330 = (SingleMthdTest *)local_320;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"ctx_dst","");
    uVar2 = (this->super_Class).cls;
    Test::Test(pTVar6,opt,(uint32_t)rVar5);
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x194;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 7;
    pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_330,
               (long)(local_330->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.rnd.
                     _M_x + (long)(&local_328->rnd + -1) + 0x1378U);
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357450;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 0;
    local_430._0_8_ = pTVar6;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>
              ((vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
                *)__return_storage_ptr__,ppSVar1,local_430);
    if (local_330 == (SingleMthdTest *)local_320) goto LAB_001e3421;
  }
  else {
    pTVar6 = (Test *)operator_new(0x25950);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_330 = (SingleMthdTest *)local_320;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"ctx_beta4","");
    uVar2 = (this->super_Class).cls;
    Test::Test(pTVar6,opt,(uint32_t)rVar5);
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x194;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 6;
    pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_330,
               (long)(local_330->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.rnd.
                     _M_x + (long)(&local_328->rnd + -1) + 0x1378U);
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357d08;
    local_3f8 = pTVar6;
    this_04 = (MthdCtxSurf2D *)operator_new(0x25958);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_430._0_8_ = local_430 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"ctx_surf2d","");
    uVar2 = (this->super_Class).cls;
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_04,opt,(uint32_t)rVar5,(string *)local_430,7,uVar2,0x198,uVar2 != 0x77 | 2);
    local_3f0 = this_04;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>
              ((vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
                *)__return_storage_ptr__,ppSVar1,&local_3f8);
    if ((Test *)local_430._0_8_ != (Test *)(local_430 + 0x10)) {
      operator_delete((void *)local_430._0_8_);
    }
    if (local_330 == (SingleMthdTest *)local_320) goto LAB_001e3421;
  }
  operator_delete(local_330);
LAB_001e3421:
  uVar3 = (this->super_Class).cls;
  if (uVar3 == 99 || (char)uVar3 == -0x77) {
    ppSVar1 = (__return_storage_ptr__->
              super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pTVar6 = (Test *)operator_new(0x25950);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_330 = (SingleMthdTest *)local_320;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"dither","");
    uVar2 = (this->super_Class).cls;
    Test::Test(pTVar6,opt,(uint32_t)rVar5);
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x2fc;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0x14;
    pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_330,
               (long)(local_330->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.rnd.
                     _M_x + (long)(&local_328->rnd + -1) + 0x1378U);
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357738;
    local_430._0_8_ = pTVar6;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>
              ((vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
                *)__return_storage_ptr__,ppSVar1,local_430);
    if (local_330 != (SingleMthdTest *)local_320) {
      operator_delete(local_330);
    }
    uVar3 = (uint)(byte)(this->super_Class).cls;
  }
  if ((char)uVar3 == -0x77) {
    ppSVar1 = (__return_storage_ptr__->
              super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pTVar6 = (Test *)operator_new(0x25950);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_330 = (SingleMthdTest *)local_320;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"sync","");
    uVar2 = (this->super_Class).cls;
    Test::Test(pTVar6,opt,(uint32_t)rVar5);
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar2;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x108;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
    pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_330,
               (long)(local_330->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.rnd.
                     _M_x + (long)(&local_328->rnd + -1) + 0x1378U);
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356b98;
    local_430._0_8_ = pTVar6;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>
              ((vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
                *)__return_storage_ptr__,ppSVar1,local_430);
    if (local_330 != (SingleMthdTest *)local_320) {
      operator_delete(local_330);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> Sifm::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_src", 2, cls, 0x184, 0, DMA_R),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x37),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdSifmFormat(opt, rnd(), "format", 8, cls, 0x300, cls != 0x37),
		new MthdOperation(opt, rnd(), "operation", 9, cls, 0x304, cls != 0x37),
		new MthdClipXy(opt, rnd(), "clip_xy", 10, cls, 0x308, 1, 0),
		new MthdClipRect(opt, rnd(), "clip_rect", 11, cls, 0x30c, 1),
		new MthdSifmXy(opt, rnd(), "xy", 12, cls, 0x310),
		new MthdSifmRect(opt, rnd(), "rect", cls == 0x37 ? 11 : 13, cls, 0x314),
		new MthdSifmDuDx(opt, rnd(), "dudx", 14, cls, 0x318, 0),
		new MthdSifmDvDy(opt, rnd(), "dvdy", 15, cls, 0x31c, 0),
		new MthdSifmSrcSize(opt, rnd(), "src_size", 16, cls, 0x400, 0),
		new MthdSifmPitch(opt, rnd(), "pitch", 17, cls, 0x404),
		new MthdSifmOffset(opt, rnd(), "offset", 18, cls, 0x408, 0),
		new MthdSifmSrcPos(opt, rnd(), "src_pos", 19, cls, 0x40c, 0, true),
	};
	if (cls == 0xe) {
		res.insert(res.end(), {
			new MthdSyfmSrcSize(opt, rnd(), "src_size_yuv420", -1, cls, 0x400),
			new MthdSyfmPitch(opt, rnd(), "pitch_yuv420", -1, cls, 0x404),
			new MthdSyfmOffset(opt, rnd(), "offset_yuv420", -1, cls, 0x408, 3),
			new MthdSyfmSrcPos(opt, rnd(), "src_pos_yuv420", -1, cls, 0x414),
			new MthdSifmInvalid(opt, rnd(), "invalid_yuv420", -1, cls, 0x410, 2),
		});
	}
	if (cls == 0x37) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, (cls == 0x77 ? SURF2D_NV4 : SURF2D_NV10) | SURF2D_SWZOK),
		});
	}
	if (cls == 0x63 || (cls & 0xff) == 0x89) {
		res.insert(res.begin(), {
			new MthdDither(opt, rnd(), "dither", 20, cls, 0x2fc),
		});
	}
	if ((cls & 0xff) == 0x89) {
		res.insert(res.begin(), {
			new MthdSync(opt, rnd(), "sync", -1, cls, 0x108),
		});
	}
	return res;
}